

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

bool math::wide_integer::uintwide_t<12288u,unsigned_int,void,false>::
     eval_subtract_n<unsigned_int*,unsigned_int_const*,unsigned_int_const*>
               (uint *r,uint *u,uint *v,unsigned_fast_type count,bool has_borrow_in)

{
  uint uVar1;
  unsigned_fast_type uVar2;
  ulong uVar3;
  
  uVar1 = (uint)has_borrow_in;
  for (uVar2 = 0; count != uVar2; uVar2 = uVar2 + 1) {
    uVar3 = ((ulong)u[uVar2] - (ulong)(uVar1 & 1)) - (ulong)v[uVar2];
    r[uVar2] = (uint)uVar3;
    uVar1 = (uint)(uVar3 >> 0x20 != 0);
  }
  return (bool)((byte)uVar1 & 1);
}

Assistant:

static constexpr auto eval_subtract_n(      ResultIterator     r,
                                                InputIteratorLeft  u,
                                                InputIteratorRight v,
                                          const unsigned_fast_type count,
                                          const bool               has_borrow_in = false) -> bool
    {
      auto has_borrow_out =
        static_cast<std::uint_fast8_t>
        (
          has_borrow_in ? static_cast<std::uint_fast8_t>(UINT8_C(1))
                        : static_cast<std::uint_fast8_t>(UINT8_C(0))
        );

      using local_limb_type = typename detail::iterator_detail::iterator_traits<ResultIterator>::value_type;

      static_assert
      (
           (std::numeric_limits<local_limb_type>::digits == std::numeric_limits<typename detail::iterator_detail::iterator_traits<InputIteratorLeft>::value_type>::digits)
        && (std::numeric_limits<local_limb_type>::digits == std::numeric_limits<typename detail::iterator_detail::iterator_traits<InputIteratorRight>::value_type>::digits),
        "Error: Internals require same widths for left-right-result limb_types at the moment"
      );

      using local_double_limb_type =
        typename detail::uint_type_helper<static_cast<size_t>(std::numeric_limits<local_limb_type>::digits * 2)>::exact_unsigned_type;

      using result_difference_type = typename detail::iterator_detail::iterator_traits<ResultIterator>::difference_type;

      for(auto i = static_cast<unsigned_fast_type>(UINT8_C(0)); i < count; ++i)
      {
        const auto uv_as_ularge =
          static_cast<local_double_limb_type>
          (
              static_cast<local_double_limb_type>(static_cast<local_double_limb_type>(*u++) - *v++)
            - has_borrow_out
          );

        has_borrow_out =
          static_cast<std::uint_fast8_t>
          (
            (detail::make_hi<local_limb_type>(uv_as_ularge) != static_cast<local_limb_type>(UINT8_C(0)))
              ? static_cast<std::uint_fast8_t>(UINT8_C(1))
              : static_cast<std::uint_fast8_t>(UINT8_C(0))
          );

        *detail::advance_and_point(r, static_cast<result_difference_type>(i)) = static_cast<local_limb_type>(uv_as_ularge);
      }

      return (has_borrow_out != static_cast<std::uint_fast8_t>(UINT8_C(0)));
    }